

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ControlClosure.h
# Opt level: O3

set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_> * __thiscall
dg::StrongControlClosure::theta
          (set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_>
           *__return_storage_ptr__,StrongControlClosure *this,
          set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_> *X,CDNode *n)

{
  _Rb_tree_header *p_Var1;
  _Base_ptr p_Var2;
  _Base_ptr p_Var3;
  CDNode *local_18;
  anon_class_8_1_6972301e local_10;
  
  p_Var1 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var2 = (X->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
  local_18 = n;
  if (p_Var2 != (_Base_ptr)0x0) {
    p_Var1 = &(X->_M_t)._M_impl.super__Rb_tree_header;
    p_Var3 = &p_Var1->_M_header;
    do {
      if (*(CDNode **)(p_Var2 + 1) >= n) {
        p_Var3 = p_Var2;
      }
      p_Var2 = (&p_Var2->_M_left)[*(CDNode **)(p_Var2 + 1) < n];
    } while (p_Var2 != (_Base_ptr)0x0);
    if (((_Rb_tree_header *)p_Var3 != p_Var1) && (*(CDNode **)(p_Var3 + 1) <= n)) {
      std::
      _Rb_tree<dg::CDNode*,dg::CDNode*,std::_Identity<dg::CDNode*>,std::less<dg::CDNode*>,std::allocator<dg::CDNode*>>
      ::_M_insert_unique<dg::CDNode*const&>
                ((_Rb_tree<dg::CDNode*,dg::CDNode*,std::_Identity<dg::CDNode*>,std::less<dg::CDNode*>,std::allocator<dg::CDNode*>>
                  *)__return_storage_ptr__,&local_18);
      return __return_storage_ptr__;
    }
  }
  local_10.retval = __return_storage_ptr__;
  foreachFirstReachable<std::set<dg::CDNode*,std::less<dg::CDNode*>,std::allocator<dg::CDNode*>>,dg::StrongControlClosure::theta(std::set<dg::CDNode*,std::less<dg::CDNode*>,std::allocator<dg::CDNode*>>const&,dg::CDNode*)::_lambda(dg::CDNode*)_1_>
            (this,X,n,&local_10);
  return __return_storage_ptr__;
}

Assistant:

std::set<CDNode *> theta(const std::set<CDNode *> &X, CDNode *n) {
        std::set<CDNode *> retval;
        if (X.count(n) > 0) {
            retval.insert(n);
            return retval;
        }
        foreachFirstReachable(X, n, [&](CDNode *cur) { retval.insert(cur); });
        return retval;
    }